

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O1

_Bool borg_check_rest(wchar_t y,wchar_t x)

{
  wchar_t y_00;
  uint uVar1;
  bool bVar2;
  chunk_conflict *c;
  monster_race *pmVar3;
  borg_kill *pbVar4;
  _Bool _Var5;
  byte bVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  loc grid;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  if ((((borg.trait[0x1b] != borg.trait[0x1c]) ||
       (_Var5 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags",
                             "(PF_COMBAT_REGEN)"), !_Var5)) &&
      (borg_t < borg.when_last_kill_mult || (int)borg.when_last_kill_mult <= borg_t + -4)) &&
     (((((borg.temp.bless == false && (borg.temp.hero == false)) &&
        ((borg.temp.berserk == false &&
         ((borg.temp.fastcast == false && (borg.temp.regen == false)))))) &&
       (borg.temp.smite_evil != true)) ||
      (((borg.munchkin_mode != false || (borg.trait[0x1b] < (borg.trait[0x1c] << 3) / 10)) ||
       (borg.trait[0x1e] < (borg.trait[0x1f] * 7) / 10)))))) {
    borg.when_last_kill_mult = 0;
    if (vault_on_level == true) {
      bVar2 = false;
      iVar14 = -1;
      do {
        lVar13 = -1;
        do {
          c = cave;
          grid = (loc)loc(borg.c.x + (int)lVar13,borg.c.y + iVar14);
          _Var5 = square_in_bounds_fully(c,grid);
          if ((_Var5) &&
             (borg_grids[(long)borg.c.y + (long)iVar14][borg.c.x + lVar13].feat == '\x16')) {
            bVar2 = true;
          }
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 1);
        bVar16 = iVar14 != 0;
        iVar14 = iVar14 + 1;
      } while (bVar16);
    }
    else {
      bVar2 = false;
    }
    if ((0 < borg.no_rest_prep) && (borg.munchkin_mode == false)) {
      iVar14 = borg.trait[0x1f];
      iVar10 = iVar14 + 3;
      if (-1 < iVar14) {
        iVar10 = iVar14;
      }
      if ((iVar10 >> 2 < borg.trait[0x1e]) && (borg.trait[0x69] < 0x55)) {
        return false;
      }
    }
    if (((borg_grids[y][x].feat != '\x17') || (borg.trait[0x40] != 0)) &&
       ((bVar2 || ((((((int)(uint)borg_fear_region[y / 0xb][x / 0xb] <= borg.trait[0x1b] / 0x14 ||
                      (borg.trait[0x69] == 100)) &&
                     (((int)(uint)borg_fear_monsters[y][x] <= borg.trait[0x1b] / 10 ||
                      (borg.trait[0x69] == 100)))) &&
                    ((wVar8 = borg_danger(y,x,L'\x01',true,false), wVar8 <= borg.trait[0x1b] / 0x28
                     || (borg.trait[0x69] < 0x55)))) &&
                   (((borg.trait[0x1a] != 0 && ((borg.trait[0x6c] == 0 && (1 < borg.trait[0x27]))))
                    || (borg.munchkin_mode == true)))))))) {
      if (borg_kills_nxt < 2) {
        return true;
      }
      lVar15 = 1;
      lVar13 = 0x1d8;
      do {
        pbVar4 = borg_kills;
        pmVar3 = r_info;
        uVar9 = (ulong)*(ushort *)(borg_kills->spell + lVar13 + -0x19);
        bVar6 = 10;
        if (uVar9 != 0) {
          wVar8 = *(wchar_t *)(borg_kills->spell + lVar13 + -0xd);
          y_00 = *(wchar_t *)(borg_kills->spell + lVar13 + -9);
          uVar11 = wVar8 - x;
          uVar1 = -uVar11;
          if (0 < (int)uVar11) {
            uVar1 = uVar11;
          }
          uVar12 = y_00 - y;
          uVar11 = -uVar12;
          if (0 < (int)uVar12) {
            uVar11 = uVar12;
          }
          if ((int)uVar11 < (int)uVar1) {
            uVar11 = uVar1;
          }
          if (uVar11 <= z_info->max_range) {
            if (uVar11 < 2) {
              _Var5 = flag_has_dbg(r_info[uVar9].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
              bVar6 = 1;
              if ((uVar11 == 1) || (!_Var5)) goto LAB_0021de6d;
            }
            if (uVar11 < 10) {
              _Var5 = flag_has_dbg(pmVar3[uVar9].flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
              bVar6 = 1;
              if (_Var5) goto LAB_0021de6d;
            }
            if (((((uVar11 < 9) || (pbVar4->spell[lVar13 + -0x16] != '\0')) ||
                 (bVar6 = 10, borg.munchkin_mode == true)) &&
                (((wVar7 = borg_danger_one_kill(y_00,wVar8,L'\x01',(wchar_t)lVar15,true,true),
                  4 < uVar11 || bVar2 != false || (wVar7 <= avoidance / 3)) ||
                 (bVar6 = 1, borg.munchkin_mode == true)))) &&
               ((_Var5 = borg_los(y_00,wVar8,y,x), !_Var5 ||
                (bVar6 = 1, pbVar4->spell[lVar13 + -1] == '\0')))) {
              if ((borg.munchkin_mode == true) &&
                 ((_Var5 = borg_los(y_00,wVar8,y,x), _Var5 &&
                  (pbVar4->spell[lVar13 + -0x16] == '\x01')))) {
                _Var5 = flag_has_dbg(pmVar3[uVar9].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
                bVar6 = 1;
                if (!_Var5) goto LAB_0021de6d;
              }
              _Var5 = flag_has_dbg(pmVar3[uVar9].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
              bVar6 = 1;
              if ((~_Var5 & 1U) != 0 || bVar2 != false) {
                _Var5 = flag_has_dbg(pmVar3[uVar9].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
                bVar6 = _Var5 & (bVar2 ^ 1U);
              }
            }
          }
        }
LAB_0021de6d:
        if ((bVar6 != 10) && (bVar6 != 0)) {
          return false;
        }
        lVar15 = lVar15 + 1;
        lVar13 = lVar13 + 0x1d8;
        if (borg_kills_nxt <= lVar15) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool borg_check_rest(int y, int x)
{
    int  i, ii;
    bool borg_in_vault = false;

    /* never rest to recover SP (if HP at max) if you only recover */
    /* sp in combat */
    if (borg.trait[BI_CURHP] == borg.trait[BI_MAXHP]
        && player_has(player, PF_COMBAT_REGEN))
        return false;

    /* Do not rest recently after killing a multiplier */
    /* This will avoid the problem of resting next to */
    /* an unkown area full of breeders */
    if (borg.when_last_kill_mult > (borg_t - 4)
        && borg.when_last_kill_mult <= borg_t)
        return false;

    /* No resting if Blessed and good HP and good SP */
    /* don't rest for SP if you do combat regen */
    if ((borg.temp.bless || borg.temp.hero || borg.temp.berserk
            || borg.temp.fastcast || borg.temp.regen || borg.temp.smite_evil)
        && !borg.munchkin_mode
        && (borg.trait[BI_CURHP] >= borg.trait[BI_MAXHP] * 8 / 10)
        && (borg.trait[BI_CURSP] >= borg.trait[BI_MAXSP] * 7 / 10))
        return false;

    /* Set this to Zero */
    borg.when_last_kill_mult = 0;

    /* Most of the time, its ok to rest in a vault */
    if (vault_on_level) {
        for (i = -1; i < 1; i++) {
            for (ii = -1; ii < 1; ii++) {
                /* check bounds */
                if (!square_in_bounds_fully(
                        cave, loc(borg.c.x + ii, borg.c.y + i)))
                    continue;

                if (borg_grids[borg.c.y + i][borg.c.x + ii].feat == FEAT_PERM)
                    borg_in_vault = true;
            }
        }
    }

    /* No resting to recover if I just cast a prepatory spell
     * which is what I like to do right before I take a stair,
     * Unless I am down by three quarters of my SP.
     */
    if (borg.no_rest_prep >= 1 && !borg.munchkin_mode
        && borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4
        && borg.trait[BI_CDEPTH] < 85)
        return false;

    /* Don't rest on lava unless we are immune to fire */
    if (borg_grids[y][x].feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Dont worry about fears if in a vault */
    if (!borg_in_vault) {
        /* Be concerned about the Regional Fear. */
        if (borg_fear_region[y / 11][x / 11] > borg.trait[BI_CURHP] / 20
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Fear. */
        if (borg_fear_monsters[y][x] > borg.trait[BI_CURHP] / 10
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Danger. */
        if (borg_danger(y, x, 1, true, false) > borg.trait[BI_CURHP] / 40
            && borg.trait[BI_CDEPTH] >= 85)
            return false;

        /* Be concerned if low on food */
        if ((borg.trait[BI_LIGHT] == 0 || borg.trait[BI_ISWEAK]
                || borg.trait[BI_FOOD] < 2)
            && !borg.munchkin_mode)
            return false;
    }

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill           *kill  = &borg_kills[i];
        struct monster_race *r_ptr = &r_info[kill->r_idx];

        int x9                     = kill->pos.x;
        int y9                     = kill->pos.y;
        int ax, ay, d;
        int p = 0;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > x) ? (x9 - x) : (x - x9);
        ay = (y9 > y) ? (y9 - y) : (y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* Minimal distance */
        if (d > z_info->max_range)
            continue;

        /* if too close to a Mold or other Never-Mover, don't rest */
        if (d < 2 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE)))
            return false;
        if (d == 1)
            return false;

        /* if too close to a Multiplier, don't rest */
        if (d < 10 && (rf_has(r_ptr->flags, RF_MULTIPLY)))
            return false;

        /* If monster is asleep, dont worry */
        if (!kill->awake && d > 8 && !borg.munchkin_mode)
            continue;

        /* one call for dangers */
        p = borg_danger_one_kill(y9, x9, 1, i, true, true);

        /* Ignore proximity checks while inside a vault */
        if (!borg_in_vault) {
            /* Real scary guys pretty close */
            if (d < 5 && (p > avoidance / 3) && !borg.munchkin_mode)
                return false;

            /* scary guys far away */
            /*if (d < 17 && d > 5 && (p > avoidance/3)) return false; */
        }

        /* should check LOS... monster to me concerned for Ranged Attacks */
        if (borg_los(y9, x9, y, x) && kill->ranged_attack)
            return false;

        /* Special handling for the munchkin mode */
        if (borg.munchkin_mode && borg_los(y9, x9, y, x)
            && (kill->awake && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))))
            return false;

        /* if it walks through walls, not safe */
        if ((rf_has(r_ptr->flags, RF_PASS_WALL)) && !borg_in_vault)
            return false;
        if (rf_has(r_ptr->flags, RF_KILL_WALL) && !borg_in_vault)
            return false;
    }
    return true;
}